

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuThreadUtil.cpp
# Opt level: O0

void __thiscall tcu::ThreadUtil::Operation::Operation(Operation *this,char *name)

{
  Event *this_00;
  char *name_local;
  Operation *this_local;
  
  this->_vptr_Operation = (_func_int **)&PTR__Operation_032ecc88;
  this->m_name = name;
  std::
  vector<de::SharedPtr<tcu::ThreadUtil::Event>,_std::allocator<de::SharedPtr<tcu::ThreadUtil::Event>_>_>
  ::vector(&this->m_deps);
  this_00 = (Event *)operator_new(0x18);
  Event::Event(this_00);
  de::SharedPtr<tcu::ThreadUtil::Event>::SharedPtr(&this->m_event,this_00);
  return;
}

Assistant:

Operation::Operation (const char* name)
	: m_name	(name)
	, m_event	(new Event)
{
}